

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBadTypeAttributes.cpp
# Opt level: O1

void anon_unknown.dwarf_574b8::testTiledWithBadAttribute(char *file)

{
  _Rb_tree_header *p_Var1;
  size_t __n;
  char *file_00;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Header *pHVar6;
  long lVar7;
  undefined8 *puVar8;
  long *plVar9;
  int iVar10;
  char *pcVar11;
  MultiPartInputFile *pMVar12;
  int iVar13;
  TiledInputPart tip;
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> value;
  TiledInputFile in;
  InputFile sin;
  MultiPartInputFile multiin;
  int local_b8;
  int local_b4;
  undefined1 local_b0 [8];
  vector<Imath_3_2::half,_std::allocator<Imath_3_2::half>_> local_a8;
  undefined1 local_88 [16];
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_78;
  char *local_48;
  MultiPartInputFile local_40 [16];
  
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)local_88,file,iVar3);
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  pHVar6 = (Header *)Imf_3_2::TiledInputFile::header();
  doFrameBuffer(&local_a8,pHVar6,(FrameBuffer *)&local_78);
  Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)local_88);
  Imf_3_2::TiledInputFile::header();
  lVar7 = Imf_3_2::Header::tileDescription();
  iVar3 = *(int *)(lVar7 + 8);
  local_b4 = 1;
  if (iVar3 == 0) {
    local_b8 = 1;
  }
  else if (iVar3 == 1) {
    local_b8 = Imf_3_2::TiledInputFile::numXLevels();
  }
  else if (iVar3 == 2) {
    local_b8 = Imf_3_2::TiledInputFile::numXLevels();
    local_b4 = Imf_3_2::TiledInputFile::numYLevels();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid tile mode ",0x12);
    plVar9 = (long *)std::ostream::operator<<(&std::cerr,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    local_b4 = 0;
    std::ostream::flush();
    local_b8 = 0;
  }
  local_48 = file;
  if (0 < local_b8) {
    iVar3 = 0;
    do {
      if (0 < local_b4) {
        iVar10 = 0;
        do {
          iVar13 = (int)local_88;
          iVar4 = Imf_3_2::TiledInputFile::numXTiles(iVar13);
          iVar5 = Imf_3_2::TiledInputFile::numYTiles(iVar13);
          Imf_3_2::TiledInputFile::readTiles(iVar13,0,iVar4 + -1,0,iVar5 + -1,iVar3);
          iVar10 = iVar10 + 1;
        } while (local_b4 != iVar10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != local_b8);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_78);
  if (local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar3 = Imf_3_2::globalThreadCount();
  p_Var1 = &local_78._M_impl.super__Rb_tree_header;
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_40,local_48,iVar3,true);
  Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)local_b0,local_40,0);
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pHVar6 = (Header *)Imf_3_2::TiledInputPart::header();
  doFrameBuffer(&local_a8,pHVar6,(FrameBuffer *)&local_78);
  Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)local_b0);
  Imf_3_2::TiledInputPart::header();
  cVar2 = Imf_3_2::Header::hasType();
  if (cVar2 != '\0') {
    Imf_3_2::TiledInputPart::header();
    puVar8 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
    __n = puVar8[1];
    if ((__n != _DAT_001eee38) ||
       ((__n != 0 && (iVar3 = bcmp((void *)*puVar8,Imf_3_2::TILEDIMAGE_abi_cxx11_,__n), iVar3 != 0))
       )) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"tiled image/part didn\'t have tiledimage type\n",0x2d);
    }
  }
  Imf_3_2::TiledInputPart::header();
  lVar7 = Imf_3_2::Header::tileDescription();
  iVar3 = *(int *)(lVar7 + 8);
  local_b4 = 1;
  if (iVar3 == 0) {
    local_b8 = 1;
  }
  else if (iVar3 == 1) {
    local_b8 = Imf_3_2::TiledInputPart::numXLevels();
  }
  else if (iVar3 == 2) {
    local_b8 = Imf_3_2::TiledInputPart::numXLevels();
    local_b4 = Imf_3_2::TiledInputPart::numYLevels();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid tile mode ",0x12);
    plVar9 = (long *)std::ostream::operator<<(&std::cerr,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    local_b4 = 0;
    std::ostream::flush();
    local_b8 = 0;
  }
  if (0 < local_b8) {
    iVar3 = 0;
    do {
      if (0 < local_b4) {
        iVar10 = 0;
        do {
          iVar13 = (int)local_b0;
          iVar4 = Imf_3_2::TiledInputPart::numXTiles(iVar13);
          iVar5 = Imf_3_2::TiledInputPart::numYTiles(iVar13);
          Imf_3_2::TiledInputPart::readTiles(iVar13,0,iVar4 + -1,0,iVar5 + -1,iVar3);
          iVar10 = iVar10 + 1;
        } while (local_b4 != iVar10);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != local_b8);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_78);
  if (local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<Imath_3_2::half,_std::allocator<Imath_3_2::half>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  iVar3 = Imf_3_2::globalThreadCount();
  file_00 = local_48;
  pcVar11 = local_48;
  Imf_3_2::InputFile::InputFile((InputFile *)&local_78,local_48,iVar3);
  readScanlineThing<Imf_3_2::InputFile>((InputFile *)&local_78,SUB81(pcVar11,0));
  Imf_3_2::InputFile::~InputFile((InputFile *)&local_78);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_40);
  iVar3 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile
            ((MultiPartInputFile *)&local_78,file_00,iVar3,true);
  pMVar12 = (MultiPartInputFile *)&local_78;
  Imf_3_2::InputPart::InputPart((InputPart *)&local_a8,pMVar12,0);
  readScanlineThing<Imf_3_2::InputPart>((InputPart *)&local_a8,SUB81(pMVar12,0));
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_78);
  checkDeepTypesFailToLoad(file_00);
  Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)local_88);
  return;
}

Assistant:

void
testTiledWithBadAttribute (const char* file)
{
    // it's a tiled file, so it should read as a file
    TiledInputFile in (file);
    readTiledThing (in, false);

    {
        // it should also read using the multipart API (and have its attribute fixed)
        MultiPartInputFile multiin (file);
        TiledInputPart     tip (multiin, 0);
        readTiledThing (tip, true);

        // it should also read using the regular file API as a scanline file
        InputFile sin (file);
        readScanlineThing (sin, false);
    }
    {
        // it should also read using the multipart API as a scanline file
        MultiPartInputFile multiin (file);

        InputPart ip (multiin, 0);
        readScanlineThing (ip, false);
    }

    checkDeepTypesFailToLoad (file);
}